

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

void parseOptions(int *argc,char ***argv,string *fileArg,string *fileExt)

{
  char **ppcVar1;
  string *__rhs;
  uint uVar2;
  RestartType RVar3;
  bool bVar4;
  ostream *poVar5;
  istream *piVar6;
  long lVar7;
  CLOParser *pCVar8;
  char *pcVar9;
  size_t sStack_230;
  bool boolBuffer;
  int intBuffer;
  char sep;
  int local_210;
  int local_20c;
  string *local_208;
  string stringBuffer;
  CLOParser cop;
  stringstream ss;
  ulong local_1b0;
  byte abStack_198 [360];
  
  local_20c = 1;
  local_208 = fileExt;
  for (local_210 = 1; local_210 < *argc; local_210 = local_210 + 1) {
    cop.argv = *argv;
    cop.i = &local_210;
    stringBuffer._M_dataplus._M_p = (pointer)&stringBuffer.field_2;
    stringBuffer._M_string_length = 0;
    stringBuffer.field_2._M_local_buf[0] = '\0';
    pCVar8 = &cop;
    cop.argc = *argc;
    bVar4 = CLOParser::getOption<int>(&cop,"-h --help",(int *)0x0,false);
    if (bVar4) {
      printHelp((int *)pCVar8,argv,local_208);
LAB_001992b5:
      exit(0);
    }
    pCVar8 = &cop;
    bVar4 = CLOParser::getOption<int>(&cop,"--help-all",(int *)0x0,false);
    if (bVar4) {
      printLongHelp((int *)pCVar8,argv,local_208);
      goto LAB_001992b5;
    }
    bVar4 = CLOParser::getOption<int>(&cop,"-n --n-of-solutions",&intBuffer,false);
    if (bVar4) {
      so.nof_solutions = intBuffer;
      uVar2 = so.verbosity;
    }
    else {
      bVar4 = CLOParser::getOption<int>(&cop,"-t --time-out",&intBuffer,false);
      if (bVar4) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "WARNING: the --time-out flag has recently been changed.");
        poVar5 = std::operator<<(poVar5,
                                 "The time-out is now provided in milliseconds instead of seconds");
        std::operator<<(poVar5,'\n');
        so.time_out.__r = (rep)intBuffer;
        uVar2 = so.verbosity;
      }
      else {
        bVar4 = CLOParser::getOption<int>(&cop,"-r --rnd-seed",&intBuffer,false);
        if (bVar4) {
          so.rnd_seed = intBuffer;
          uVar2 = so.verbosity;
        }
        else {
          bVar4 = CLOParser::getBool(&cop,"-v --verbose",&boolBuffer);
          if (bVar4) {
            uVar2 = (uint)boolBuffer;
          }
          else {
            bVar4 = CLOParser::getOption<int>(&cop,"--verbosity",&intBuffer,false);
            uVar2 = intBuffer;
            if (!bVar4) {
              bVar4 = CLOParser::getBool(&cop,"--print-sol",&boolBuffer);
              if (bVar4) {
                so.print_sol = boolBuffer;
                uVar2 = so.verbosity;
              }
              else {
                bVar4 = CLOParser::getOption<std::__cxx11::string>
                                  (&cop,"--restart",&stringBuffer,false);
                if (bVar4) {
                  bVar4 = std::operator==(&stringBuffer,"chuffed");
                  RVar3 = CHUFFED_DEFAULT;
                  if (!bVar4) {
                    bVar4 = std::operator==(&stringBuffer,"none");
                    RVar3 = NONE;
                    if (!bVar4) {
                      bVar4 = std::operator==(&stringBuffer,"constant");
                      RVar3 = CONSTANT;
                      if (!bVar4) {
                        bVar4 = std::operator==(&stringBuffer,"linear");
                        RVar3 = LINEAR;
                        if (!bVar4) {
                          bVar4 = std::operator==(&stringBuffer,"luby");
                          RVar3 = LUBY;
                          if (!bVar4) {
                            bVar4 = std::operator==(&stringBuffer,"geometric");
                            RVar3 = GEOMETRIC;
                            if (!bVar4) {
                              poVar5 = std::operator<<((ostream *)&std::cerr,**argv);
                              poVar5 = std::operator<<(poVar5,": Unknown restart strategy ");
                              poVar5 = std::operator<<(poVar5,(string *)&stringBuffer);
                              std::operator<<(poVar5,". Chuffed will use its default strategy.\n");
                              RVar3 = so.restart_type;
                            }
                          }
                        }
                      }
                    }
                  }
                  so.restart_type = RVar3;
                  so.restart_type_override = false;
                  uVar2 = so.verbosity;
                }
                else {
                  bVar4 = CLOParser::getOption<int>(&cop,"--restart-scale",&intBuffer,false);
                  if (bVar4) {
                    so.restart_scale = intBuffer;
                    so.restart_scale_override = false;
                    uVar2 = so.verbosity;
                  }
                  else {
                    bVar4 = CLOParser::getOption<std::__cxx11::string>
                                      (&cop,"--restart-base",&stringBuffer,false);
                    if (bVar4) {
                      poVar5 = std::operator<<((ostream *)&std::cerr,
                                               "WARNING: the --restart-base flag has recently been changed."
                                              );
                      poVar5 = std::operator<<(poVar5,
                                               "The old behaviour of \"restart base\" is now implemented by --restart-scale."
                                              );
                      std::operator<<(poVar5,'\n');
                      so.restart_base = std::__cxx11::stod(&stringBuffer,(size_t *)0x0);
                      if (so.restart_base < 1.0) {
                        fprintf(_stderr,"%s:%d: ","options.cpp",0x1ef);
                        pcVar9 = "Illegal restart base. Restart count will converge to zero.";
                        sStack_230 = 0x3a;
LAB_00199444:
                        fwrite(pcVar9,sStack_230,1,_stderr);
                        abort();
                      }
                      so.restart_base_override = false;
                      uVar2 = so.verbosity;
                    }
                    else {
                      bVar4 = CLOParser::getBool(&cop,"--toggle-vsids",&boolBuffer);
                      if (bVar4) {
                        so.toggle_vsids = boolBuffer;
                        uVar2 = so.verbosity;
                      }
                      else {
                        bVar4 = CLOParser::getBool(&cop,"--branch-random",&boolBuffer);
                        if (bVar4) {
                          so.branch_random = boolBuffer;
                          uVar2 = so.verbosity;
                        }
                        else {
                          bVar4 = CLOParser::getOption<int>
                                            (&cop,"--switch-to-vsids-after",&intBuffer,false);
                          if (bVar4) {
                            so.switch_to_vsids_after = intBuffer;
                            uVar2 = so.verbosity;
                          }
                          else {
                            bVar4 = CLOParser::getOption<int>
                                              (&cop,"--sat-polarity",&intBuffer,false);
                            if (bVar4) {
                              so.sat_polarity = intBuffer;
                              uVar2 = so.verbosity;
                            }
                            else {
                              bVar4 = CLOParser::getBool(&cop,"--sbps",&boolBuffer);
                              if (bVar4) {
                                so.sbps = boolBuffer;
                                uVar2 = so.verbosity;
                              }
                              else {
                                bVar4 = CLOParser::getBool(&cop,"--prop-fifo",&boolBuffer);
                                if (bVar4) {
                                  so.prop_fifo = boolBuffer;
                                  uVar2 = so.verbosity;
                                }
                                else {
                                  bVar4 = CLOParser::getBool(&cop,"--disj-edge-find",&boolBuffer);
                                  if (bVar4) {
                                    so.disj_edge_find = boolBuffer;
                                    uVar2 = so.verbosity;
                                  }
                                  else {
                                    bVar4 = CLOParser::getBool(&cop,"--disj-set-bp",&boolBuffer);
                                    if (bVar4) {
                                      so.disj_set_bp = boolBuffer;
                                      uVar2 = so.verbosity;
                                    }
                                    else {
                                      bVar4 = CLOParser::getBool(&cop,"--cumu-global",&boolBuffer);
                                      if (bVar4) {
                                        so.cumu_global = boolBuffer;
                                        uVar2 = so.verbosity;
                                      }
                                      else {
                                        bVar4 = CLOParser::getBool(&cop,"--sat-simplify",&boolBuffer
                                                                  );
                                        if (bVar4) {
                                          so.sat_simplify = boolBuffer;
                                          uVar2 = so.verbosity;
                                        }
                                        else {
                                          bVar4 = CLOParser::getBool(&cop,"--fd-simplify",
                                                                     &boolBuffer);
                                          if (bVar4) {
                                            so.fd_simplify = boolBuffer;
                                            uVar2 = so.verbosity;
                                          }
                                          else {
                                            bVar4 = CLOParser::getBool(&cop,"--lazy",&boolBuffer);
                                            if (bVar4) {
                                              so.lazy = boolBuffer;
                                              uVar2 = so.verbosity;
                                            }
                                            else {
                                              bVar4 = CLOParser::getBool(&cop,"--finesse",
                                                                         &boolBuffer);
                                              if (bVar4) {
                                                so.finesse = boolBuffer;
                                                uVar2 = so.verbosity;
                                              }
                                              else {
                                                bVar4 = CLOParser::getBool(&cop,"--learn",
                                                                           &boolBuffer);
                                                if (bVar4) {
                                                  so.learn = boolBuffer;
                                                  uVar2 = so.verbosity;
                                                }
                                                else {
                                                  bVar4 = CLOParser::getBool(&cop,"--vsids",
                                                                             &boolBuffer);
                                                  if (bVar4) {
                                                    so.vsids = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,
                                                  "--sort-learnt-level",&boolBuffer);
                                                  if (bVar4) {
                                                    so.sort_learnt_level = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,"--one-watch",
                                                                               &boolBuffer);
                                                    if (bVar4) {
                                                      so.one_watch = boolBuffer;
                                                      uVar2 = so.verbosity;
                                                    }
                                                    else {
                                                      bVar4 = CLOParser::getBool(&cop,
                                                  "--exclude-introduced",&boolBuffer);
                                                  if (bVar4) {
                                                    so.exclude_introduced = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,
                                                  "--decide-introduced",&boolBuffer);
                                                  if (bVar4) {
                                                    so.decide_introduced = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,
                                                  "--introduced-heuristic",&boolBuffer);
                                                  if (bVar4) {
                                                    so.introduced_heuristic = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,
                                                  "--use-var-is-introduced",&boolBuffer);
                                                  if (bVar4) {
                                                    so.use_var_is_introduced = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,"--print-nodes",
                                                                               &boolBuffer);
                                                    if (bVar4) {
                                                      so.print_nodes = boolBuffer;
                                                      uVar2 = so.verbosity;
                                                    }
                                                    else {
                                                      bVar4 = CLOParser::getBool(&cop,
                                                  "--print-variable-list",&boolBuffer);
                                                  if (bVar4) {
                                                    so.print_variable_list = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,
                                                  "--print-implications",&boolBuffer);
                                                  if (bVar4) {
                                                    so.print_implications = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,"--send-skipped"
                                                                               ,&boolBuffer);
                                                    if (bVar4) {
                                                      so.send_skipped = boolBuffer;
                                                      uVar2 = so.verbosity;
                                                    }
                                                    else {
                                                      bVar4 = CLOParser::
                                                              getOption<std::__cxx11::string>
                                                                        (&cop,"--filter-domains",
                                                                         &stringBuffer,false);
                                                      if (bVar4) {
                                                        std::__cxx11::string::_M_assign
                                                                  ((string *)&so.filter_domains);
                                                        uVar2 = so.verbosity;
                                                      }
                                                      else {
                                                        bVar4 = CLOParser::getBool(&cop,
                                                  "--learnt-stats",&boolBuffer);
                                                  if (bVar4) {
                                                    so.learnt_stats = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,
                                                  "--learnt-stats-nogood",&boolBuffer);
                                                  if (bVar4) {
                                                    so.learnt_stats_nogood = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,"--debug",
                                                                               &boolBuffer);
                                                    if (bVar4) {
                                                      so.debug = boolBuffer;
                                                      uVar2 = so.verbosity;
                                                    }
                                                    else {
                                                      bVar4 = CLOParser::getBool(&cop,
                                                  "--exhaustive-activity",&boolBuffer);
                                                  if (bVar4) {
                                                    so.exhaustive_activity = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,
                                                  "--bin-clause-opt",&boolBuffer);
                                                  if (bVar4) {
                                                    so.bin_clause_opt = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,"--assump-int",
                                                                               &boolBuffer);
                                                    if (bVar4) {
                                                      so.assump_int = boolBuffer;
                                                      uVar2 = so.verbosity;
                                                    }
                                                    else {
                                                      bVar4 = CLOParser::getOption<int>
                                                                        (&cop,"--eager-limit",
                                                                         &intBuffer,false);
                                                      if (bVar4) {
                                                        so.eager_limit = intBuffer;
                                                        uVar2 = so.verbosity;
                                                      }
                                                      else {
                                                        bVar4 = CLOParser::getOption<int>
                                                                          (&cop,"--sat-var-limit",
                                                                           &intBuffer,false);
                                                        if (bVar4) {
                                                          so.sat_var_limit = intBuffer;
                                                          uVar2 = so.verbosity;
                                                        }
                                                        else {
                                                          bVar4 = CLOParser::getOption<int>
                                                                            (&cop,"--n-of-learnts",
                                                                             &intBuffer,false);
                                                          if (bVar4) {
                                                            so.nof_learnts = intBuffer;
                                                            uVar2 = so.verbosity;
                                                          }
                                                          else {
                                                            bVar4 = CLOParser::getOption<int>
                                                                              (&cop,
                                                  "--learnts-mlimit",&intBuffer,false);
                                                  if (bVar4) {
                                                    so.learnts_mlimit = intBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,
                                                  "--lang-ext-linear",&boolBuffer);
                                                  if (bVar4) {
                                                    so.lang_ext_linear = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,"--mdd",
                                                                               &boolBuffer);
                                                    if (bVar4) {
                                                      so.mdd = boolBuffer;
                                                      uVar2 = so.verbosity;
                                                    }
                                                    else {
                                                      bVar4 = CLOParser::getBool(&cop,"--mip",
                                                                                 &boolBuffer);
                                                      if (bVar4) {
                                                        so.mip = boolBuffer;
                                                        uVar2 = so.verbosity;
                                                      }
                                                      else {
                                                        bVar4 = CLOParser::getBool(&cop,
                                                  "--mip-branch",&boolBuffer);
                                                  if (bVar4) {
                                                    so.mip_branch = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getBool(&cop,"--sym-static",
                                                                               &boolBuffer);
                                                    if (bVar4) {
                                                      so.sym_static = boolBuffer;
                                                      uVar2 = so.verbosity;
                                                    }
                                                    else {
                                                      bVar4 = CLOParser::getBool(&cop,"--ldsb",
                                                                                 &boolBuffer);
                                                      if (bVar4) {
                                                        so.ldsb = boolBuffer;
                                                        uVar2 = so.verbosity;
                                                      }
                                                      else {
                                                        bVar4 = CLOParser::getBool(&cop,"--ldsbta",
                                                                                   &boolBuffer);
                                                        if (bVar4) {
                                                          so.ldsbta = boolBuffer;
                                                          uVar2 = so.verbosity;
                                                        }
                                                        else {
                                                          bVar4 = CLOParser::getBool(&cop,"--ldsbad"
                                                                                     ,&boolBuffer);
                                                          if (bVar4) {
                                                            so.ldsbad = boolBuffer;
                                                            uVar2 = so.verbosity;
                                                          }
                                                          else {
                                                            bVar4 = CLOParser::getBool(&cop,
                                                  "--well-founded",&boolBuffer);
                                                  if (bVar4) {
                                                    so.well_founded = boolBuffer;
                                                    uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    bVar4 = CLOParser::getOption<int>
                                                                      (&cop,"-a",(int *)0x0,false);
                                                    if (bVar4) {
                                                      so.nof_solutions = 0;
                                                      uVar2 = so.verbosity;
                                                    }
                                                    else {
                                                      bVar4 = CLOParser::getOption<int>
                                                                        (&cop,"-f",(int *)0x0,false)
                                                      ;
                                                      if (bVar4) {
                                                        so.toggle_vsids = true;
                                                        so.restart_scale = 100;
                                                        uVar2 = so.verbosity;
                                                      }
                                                      else {
                                                        bVar4 = CLOParser::getOption<int>
                                                                          (&cop,"-s -S",(int *)0x0,
                                                                           false);
                                                        if (bVar4) {
                                                          so.verbosity = 1;
                                                          uVar2 = so.verbosity;
                                                        }
                                                        else {
                                                          bVar4 = CLOParser::
                                                                  getOption<std::__cxx11::string>
                                                                            (&cop,"--cp-profiler",
                                                                             &stringBuffer,false);
                                                          if (bVar4) {
                                                            std::__cxx11::stringstream::stringstream
                                                                      ((stringstream *)&ss,
                                                                       (string *)&stringBuffer,
                                                                       _S_out|_S_in);
                                                            piVar6 = (istream *)
                                                                     std::istream::operator>>
                                                                               ((istream *)&ss,
                                                                                &so.cpprofiler_id);
                                                            piVar6 = std::operator>>(piVar6,&sep);
                                                            std::istream::operator>>
                                                                      ((istream *)piVar6,
                                                                       &so.cpprofiler_port);
                                                            if ((sep != ',') ||
                                                               ((abStack_198[*(long *)(_ss + -0x18)]
                                                                & 2) == 0)) {
                                                              fprintf(_stderr,"%s:%d: ",
                                                                      "options.cpp",0x25b);
                                                              pcVar9 = 
                                                  "Invalid value for --cp-profiler.";
                                                  sStack_230 = 0x20;
                                                  goto LAB_00199444;
                                                  }
                                                  so.cpprofiler_enabled = true;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)&ss);
                                                  uVar2 = so.verbosity;
                                                  }
                                                  else {
                                                    ppcVar1 = *argv;
                                                    if (*ppcVar1[local_210] == '-') {
                                                      poVar5 = std::operator<<((ostream *)&std::cerr
                                                                               ,*ppcVar1);
                                                      poVar5 = std::operator<<(poVar5,
                                                  ": unrecognized option ");
                                                  poVar5 = std::operator<<(poVar5,(*argv)[local_210]
                                                                          );
                                                  std::operator<<(poVar5,"\n");
                                                  poVar5 = std::operator<<((ostream *)&std::cerr,
                                                                           **argv);
                                                  std::operator<<(poVar5,
                                                  ": use --help for more information.\n");
                                                  goto LAB_0019940c;
                                                  }
                                                  lVar7 = (long)local_20c;
                                                  local_20c = local_20c + 1;
                                                  ppcVar1[lVar7] = ppcVar1[local_210];
                                                  uVar2 = so.verbosity;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    so.verbosity = uVar2;
    std::__cxx11::string::~string((string *)&stringBuffer);
  }
  *argc = local_20c;
  if (fileArg != (string *)0x0) {
    if (local_20c == 2) {
      std::__cxx11::string::string((string *)&ss,(*argv)[1],(allocator *)&stringBuffer);
      __rhs = local_208;
      if (local_208->_M_string_length != 0) {
        if (local_208->_M_string_length + 1 < local_1b0) {
          std::__cxx11::string::substr((ulong)&stringBuffer,(ulong)&ss);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cop,
                         ".",__rhs);
          bVar4 = std::operator!=(&stringBuffer,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&cop);
          std::__cxx11::string::~string((string *)&cop);
          std::__cxx11::string::~string((string *)&stringBuffer);
          if (!bVar4) goto LAB_0019915c;
        }
        poVar5 = std::operator<<((ostream *)&std::cerr,**argv);
        poVar5 = std::operator<<(poVar5,": cannot handle file extension for ");
        poVar5 = std::operator<<(poVar5,(string *)&ss);
        std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<((ostream *)&std::cerr,**argv);
        std::operator<<(poVar5,": use --help for more information.\n");
LAB_0019940c:
        exit(1);
      }
LAB_0019915c:
      std::__cxx11::string::_M_assign((string *)fileArg);
      *argc = *argc + -1;
      std::__cxx11::string::~string((string *)&ss);
    }
    else if (2 < local_20c) {
      poVar5 = std::operator<<((ostream *)&std::cerr,**argv);
      std::operator<<(poVar5,": more than one file argument not supported\n");
      poVar5 = std::operator<<((ostream *)&std::cerr,**argv);
      std::operator<<(poVar5,": use --help for more information.\n");
      goto LAB_0019940c;
    }
  }
  if (1 < (byte)(so.ldsbta + so.ldsbad + so.sym_static + so.ldsb)) {
    fprintf(_stderr,"%s:%d: ","options.cpp",0x27d);
    pcVar9 = "so.sym_static + so.ldsb + so.ldsbta + so.ldsbad <= 1";
    goto LAB_0019935f;
  }
  if (((so.ldsbta | so.ldsbad) & 1U) == 0) {
    if (so.ldsb != false) goto LAB_001991be;
  }
  else {
    so.ldsb = true;
LAB_001991be:
    if (so.lazy == false) {
      fprintf(_stderr,"%s:%d: ","options.cpp",0x283);
      pcVar9 = "so.lazy";
      goto LAB_0019935f;
    }
  }
  if ((so.mip_branch != true) || (so.mip != false)) {
    if (so.vsids == true) {
      (*((engine.branching)->super_Branching)._vptr_Branching[3])(engine.branching,&sat);
    }
    if (so.learnt_stats_nogood == true) {
      so.learnt_stats = true;
    }
    if (so.sbps == true) {
      if (((so.vsids == false) && (so.toggle_vsids == false)) &&
         (999999999 < so.switch_to_vsids_after)) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "WARNING: SBPS value selection must be used with an activity-based search to optimize its efficiency."
                                );
        std::operator<<(poVar5,'\n');
      }
      if ((so.restart_type == NONE) || (so.restart_scale == 0)) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "WARNING: SBPS value selection must be used with restarts to optimize its efficiency."
                                );
        std::operator<<(poVar5,'\n');
      }
    }
    return;
  }
  fprintf(_stderr,"%s:%d: ","options.cpp",0x286);
  pcVar9 = "so.mip";
LAB_0019935f:
  fprintf(_stderr,"Assertion `%s\' failed.\n",pcVar9);
  abort();
}

Assistant:

void parseOptions(int& argc, char**& argv, std::string* fileArg, const std::string& fileExt) {
	int j = 1;
	for (int i = 1; i < argc; i++) {
		CLOParser cop(i, argc, argv);
		int intBuffer;
		bool boolBuffer;
		std::string stringBuffer;
		if (cop.get("-h --help")) {
			printHelp(argc, argv, fileExt);
			std::exit(EXIT_SUCCESS);
		}
		if (cop.get("--help-all")) {
			printLongHelp(argc, argv, fileExt);
			std::exit(EXIT_SUCCESS);
		}
		if (cop.get("-n --n-of-solutions", &intBuffer)) {
			so.nof_solutions = intBuffer;
		} else if (cop.get("-t --time-out", &intBuffer)) {
			// TODO: Remove warning when appropriate
			std::cerr << "WARNING: the --time-out flag has recently been changed."
								<< "The time-out is now provided in milliseconds instead of seconds" << '\n';
			so.time_out = duration(intBuffer);
		} else if (cop.get("-r --rnd-seed", &intBuffer)) {
			so.rnd_seed = intBuffer;
		} else if (cop.getBool("-v --verbose", boolBuffer)) {
			so.verbosity = static_cast<int>(boolBuffer);
		} else if (cop.get("--verbosity", &intBuffer)) {
			so.verbosity = intBuffer;
		} else if (cop.getBool("--print-sol", boolBuffer)) {
			so.print_sol = boolBuffer;
		} else if (cop.get("--restart", &stringBuffer)) {
			if (stringBuffer == "chuffed") {
				so.restart_type = CHUFFED_DEFAULT;
			} else if (stringBuffer == "none") {
				so.restart_type = NONE;
			} else if (stringBuffer == "constant") {
				so.restart_type = CONSTANT;
			} else if (stringBuffer == "linear") {
				so.restart_type = LINEAR;
			} else if (stringBuffer == "luby") {
				so.restart_type = LUBY;
			} else if (stringBuffer == "geometric") {
				so.restart_type = GEOMETRIC;
			} else {
				std::cerr << argv[0] << ": Unknown restart strategy " << stringBuffer
									<< ". Chuffed will use its default strategy.\n";
			}
			so.restart_type_override = false;
		} else if (cop.get("--restart-scale", &intBuffer)) {
			so.restart_scale = static_cast<unsigned int>(intBuffer);
			so.restart_scale_override = false;
		} else if (cop.get("--restart-base", &stringBuffer)) {
			// TODO: Remove warning when appropriate
			std::cerr << "WARNING: the --restart-base flag has recently been changed."
								<< "The old behaviour of \"restart base\" is now implemented by --restart-scale."
								<< '\n';
			so.restart_base = stod(stringBuffer);
			if (so.restart_base < 1.0) {
				CHUFFED_ERROR("Illegal restart base. Restart count will converge to zero.");
			}
			so.restart_base_override = false;
		} else if (cop.getBool("--toggle-vsids", boolBuffer)) {
			so.toggle_vsids = boolBuffer;
		} else if (cop.getBool("--branch-random", boolBuffer)) {
			so.branch_random = boolBuffer;
		} else if (cop.get("--switch-to-vsids-after", &intBuffer)) {
			so.switch_to_vsids_after = intBuffer;
		} else if (cop.get("--sat-polarity", &intBuffer)) {
			so.sat_polarity = intBuffer;
		} else if (cop.getBool("--sbps", boolBuffer)) {
			so.sbps = boolBuffer;
		} else if (cop.getBool("--prop-fifo", boolBuffer)) {
			so.prop_fifo = boolBuffer;
		} else if (cop.getBool("--disj-edge-find", boolBuffer)) {
			so.disj_edge_find = boolBuffer;
		} else if (cop.getBool("--disj-set-bp", boolBuffer)) {
			so.disj_set_bp = boolBuffer;
		} else if (cop.getBool("--cumu-global", boolBuffer)) {
			so.cumu_global = boolBuffer;
		} else if (cop.getBool("--sat-simplify", boolBuffer)) {
			so.sat_simplify = boolBuffer;
		} else if (cop.getBool("--fd-simplify", boolBuffer)) {
			so.fd_simplify = boolBuffer;
		} else if (cop.getBool("--lazy", boolBuffer)) {
			so.lazy = boolBuffer;
		} else if (cop.getBool("--finesse", boolBuffer)) {
			so.finesse = boolBuffer;
		} else if (cop.getBool("--learn", boolBuffer)) {
			so.learn = boolBuffer;
		} else if (cop.getBool("--vsids", boolBuffer)) {
			so.vsids = boolBuffer;
		} else if (cop.getBool("--sort-learnt-level", boolBuffer)) {
			so.sort_learnt_level = boolBuffer;
		} else if (cop.getBool("--one-watch", boolBuffer)) {
			so.one_watch = boolBuffer;
		} else if (cop.getBool("--exclude-introduced", boolBuffer)) {
			so.exclude_introduced = boolBuffer;
		} else if (cop.getBool("--decide-introduced", boolBuffer)) {
			so.decide_introduced = boolBuffer;
		} else if (cop.getBool("--introduced-heuristic", boolBuffer)) {
			so.introduced_heuristic = boolBuffer;
		} else if (cop.getBool("--use-var-is-introduced", boolBuffer)) {
			so.use_var_is_introduced = boolBuffer;
		} else if (cop.getBool("--print-nodes", boolBuffer)) {
			so.print_nodes = boolBuffer;
		} else if (cop.getBool("--print-variable-list", boolBuffer)) {
			so.print_variable_list = boolBuffer;
		} else if (cop.getBool("--print-implications", boolBuffer)) {
			so.print_implications = boolBuffer;
		} else if (cop.getBool("--send-skipped", boolBuffer)) {
			so.send_skipped = boolBuffer;
		} else if (cop.get("--filter-domains", &stringBuffer)) {
			so.filter_domains = stringBuffer;
		} else if (cop.getBool("--learnt-stats", boolBuffer)) {
			so.learnt_stats = boolBuffer;
		} else if (cop.getBool("--learnt-stats-nogood", boolBuffer)) {
			so.learnt_stats_nogood = boolBuffer;
		} else if (cop.getBool("--debug", boolBuffer)) {
			so.debug = boolBuffer;
		} else if (cop.getBool("--exhaustive-activity", boolBuffer)) {
			so.exhaustive_activity = boolBuffer;
		} else if (cop.getBool("--bin-clause-opt", boolBuffer)) {
			so.bin_clause_opt = boolBuffer;
		} else if (cop.getBool("--assump-int", boolBuffer)) {
			so.assump_int = boolBuffer;
		} else if (cop.get("--eager-limit", &intBuffer)) {
			so.eager_limit = intBuffer;
		} else if (cop.get("--sat-var-limit", &intBuffer)) {
			so.sat_var_limit = intBuffer;
		} else if (cop.get("--n-of-learnts", &intBuffer)) {
			so.nof_learnts = intBuffer;
		} else if (cop.get("--learnts-mlimit", &intBuffer)) {
			so.learnts_mlimit = intBuffer;
		} else if (cop.getBool("--lang-ext-linear", boolBuffer)) {
			so.lang_ext_linear = boolBuffer;
		} else if (cop.getBool("--mdd", boolBuffer)) {
			so.mdd = boolBuffer;
		} else if (cop.getBool("--mip", boolBuffer)) {
			so.mip = boolBuffer;
		} else if (cop.getBool("--mip-branch", boolBuffer)) {
			so.mip_branch = boolBuffer;
		} else if (cop.getBool("--sym-static", boolBuffer)) {
			so.sym_static = boolBuffer;
		} else if (cop.getBool("--ldsb", boolBuffer)) {
			so.ldsb = boolBuffer;
		} else if (cop.getBool("--ldsbta", boolBuffer)) {
			so.ldsbta = boolBuffer;
		} else if (cop.getBool("--ldsbad", boolBuffer)) {
			so.ldsbad = boolBuffer;
		} else if (cop.getBool("--well-founded", boolBuffer)) {
			so.well_founded = boolBuffer;
		} else if (cop.get("-a")) {
			so.nof_solutions = 0;
		} else if (cop.get("-f")) {
			so.toggle_vsids = true;
			so.restart_scale = 100;
		} else if (cop.get("-s -S")) {
			so.verbosity = 1;
#ifdef HAS_PROFILER
		} else if (cop.get("--cp-profiler", &stringBuffer)) {
			std::stringstream ss(stringBuffer);
			char sep;
			ss >> so.cpprofiler_id >> sep >> so.cpprofiler_port;
			if (sep == ',' && ss.eof()) {
				so.cpprofiler_enabled = true;
			} else {
				CHUFFED_ERROR("Invalid value for --cp-profiler.");
			}
#endif
		} else if (argv[i][0] == '-') {
			std::cerr << argv[0] << ": unrecognized option " << argv[i] << "\n";
			std::cerr << argv[0] << ": use --help for more information.\n";
			std::exit(EXIT_FAILURE);
		} else {
			argv[j++] = argv[i];
		}
	}

	argc = j;

	if (fileArg != nullptr) {
		if (argc == 2) {
			const std::string filename(argv[1]);
			if (!fileExt.empty()) {
				if (filename.size() <= fileExt.size() + 1 ||
						filename.substr(filename.size() - fileExt.size() - 1) != "." + fileExt) {
					std::cerr << argv[0] << ": cannot handle file extension for " << filename << "\n";
					std::cerr << argv[0] << ": use --help for more information.\n";
					std::exit(EXIT_FAILURE);
				}
			}
			*fileArg = filename;
			--argc;
		} else if (argc > 2) {
			std::cerr << argv[0] << ": more than one file argument not supported\n";
			std::cerr << argv[0] << ": use --help for more information.\n";
			std::exit(EXIT_FAILURE);
		}
	}

	rassert(so.sym_static + so.ldsb + so.ldsbta + so.ldsbad <= 1);

	if (so.ldsbta || so.ldsbad) {
		so.ldsb = true;
	}
	if (so.ldsb) {
		rassert(so.lazy);
	}
	if (so.mip_branch) {
		rassert(so.mip);
	}
	if (so.vsids) {
		engine.branching->add(&sat);
	}

	if (so.learnt_stats_nogood) {
		so.learnt_stats = true;
	}

	// Warn user if SBPS is not used with an activity-based search and restarts
	if (so.sbps) {
		if (!(so.vsids || so.toggle_vsids || so.switch_to_vsids_after < 1000000000)) {
			std::cerr << "WARNING: SBPS value selection must be used with an activity-based search to "
									 "optimize its "
									 "efficiency."
								<< '\n';
		}
		if (so.restart_type == NONE || so.restart_scale == 0) {
			std::cerr << "WARNING: SBPS value selection must be used with restarts to optimize its "
									 "efficiency."
								<< '\n';
		}
	}
}